

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O2

void __thiscall kj::_::Mutex::lock(Mutex *this,Exclusivity exclusivity)

{
  uint uVar1;
  ulong in_RAX;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  
  if (exclusivity == SHARED) {
    LOCK();
    uVar1 = this->futex;
    this->futex = this->futex + 1;
    UNLOCK();
    uVar3 = uVar1 + 1;
    while ((int)uVar3 < 0) {
      in_RAX = in_RAX & 0xffffffff00000000;
      syscall(0xca,this,0x80,(ulong)uVar3,0,0,in_RAX);
      uVar3 = this->futex;
    }
  }
  else if (exclusivity == EXCLUSIVE) {
LAB_0032026c:
    LOCK();
    uVar3 = this->futex;
    bVar4 = uVar3 == 0;
    if (bVar4) {
      this->futex = 0x80000000;
      uVar3 = 0;
    }
    UNLOCK();
    if (!bVar4) {
      uVar2 = uVar3;
      if ((uVar3 >> 0x1e & 1) == 0) goto code_r0x0032027a;
      goto LAB_0032028a;
    }
  }
  return;
code_r0x0032027a:
  uVar2 = uVar3 | 0x40000000;
  LOCK();
  bVar4 = uVar3 == this->futex;
  if (bVar4) {
    this->futex = uVar2;
  }
  UNLOCK();
  if (bVar4) {
LAB_0032028a:
    in_RAX = in_RAX & 0xffffffff00000000;
    syscall(0xca,this,0x80,(ulong)uVar2,0,0,in_RAX);
  }
  goto LAB_0032026c;
}

Assistant:

void Mutex::lock(Exclusivity exclusivity) {
  switch (exclusivity) {
    case EXCLUSIVE:
      for (;;) {
        uint state = 0;
        if (KJ_LIKELY(__atomic_compare_exchange_n(&futex, &state, EXCLUSIVE_HELD, false,
                                                  __ATOMIC_ACQUIRE, __ATOMIC_RELAXED))) {
          // Acquired.
          break;
        }

        // The mutex is contended.  Set the exclusive-requested bit and wait.
        if ((state & EXCLUSIVE_REQUESTED) == 0) {
          if (!__atomic_compare_exchange_n(&futex, &state, state | EXCLUSIVE_REQUESTED, false,
                                           __ATOMIC_RELAXED, __ATOMIC_RELAXED)) {
            // Oops, the state changed before we could set the request bit.  Start over.
            continue;
          }

          state |= EXCLUSIVE_REQUESTED;
        }

        syscall(SYS_futex, &futex, FUTEX_WAIT_PRIVATE, state, NULL, NULL, 0);
      }
      break;
    case SHARED: {
      uint state = __atomic_add_fetch(&futex, 1, __ATOMIC_ACQUIRE);
      for (;;) {
        if (KJ_LIKELY((state & EXCLUSIVE_HELD) == 0)) {
          // Acquired.
          break;
        }

        // The mutex is exclusively locked by another thread.  Since we incremented the counter
        // already, we just have to wait for it to be unlocked.
        syscall(SYS_futex, &futex, FUTEX_WAIT_PRIVATE, state, NULL, NULL, 0);
        state = __atomic_load_n(&futex, __ATOMIC_ACQUIRE);
      }
      break;
    }
  }
}